

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O3

void __thiscall test::test_generate_and_sign::test_method(test_generate_and_sign *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  string signature;
  string privateK;
  long *local_110;
  shared_count *local_108;
  ulong local_100;
  shared_count sStack_f8;
  char *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8;
  undefined8 local_a0;
  shared_count sStack_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  license::CryptoHelper::getInstance();
  (**(code **)*local_110)();
  (**(code **)(*local_110 + 8))(&local_c8);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x31);
  if (local_c0 == 0) {
LAB_00180452:
    bVar4 = false;
  }
  else {
    uVar1 = local_c0 - 1;
    uVar2 = 0x1e;
    if (uVar1 < 0x1e) {
      uVar2 = uVar1;
    }
    lVar3 = 0;
    do {
      if (local_c8[lVar3] != "-----BEGIN RSA PRIVATE KEY-----"[lVar3]) goto LAB_00180452;
      lVar3 = lVar3 + 1;
    } while (uVar2 + 1 != lVar3);
    bVar4 = 0x1d < uVar1;
  }
  local_108 = (shared_count *)CONCAT71(local_108._1_7_,bVar4);
  local_100 = 0;
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00542d70;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = "Private key is in openssl pkcs#1 format";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f8);
  local_108 = &sStack_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"testString","");
  (**(code **)(*local_110 + 0x28))(&local_e8,local_110,&local_108);
  if (local_108 != &sStack_f8) {
    operator_delete(local_108);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x33);
  local_a8 = CONCAT71(uStack_df,local_e0) == 0xac;
  local_a0 = 0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_100 = local_100 & 0xffffffffffffff00;
  local_108 = (shared_count *)&PTR__lazy_ostream_00542db0;
  sStack_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f0 = "signature is the right size";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_generate_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->generateKeyPair();
	const string privateK = crypto->exportPrivateKey();
	BOOST_CHECK_MESSAGE(boost::starts_with(privateK, "-----BEGIN RSA PRIVATE KEY-----"),
						"Private key is in openssl pkcs#1 format");
	const std::string signature = crypto->signString("testString");
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	crypto.release();
	/*
	 ofstream myfile("private_key-linux.rsa");
	 myfile << privateK;
	 myfile.close();*/
}